

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sort_key.cpp
# Opt level: O0

void duckdb::TemplatedGetSortKeyLength<duckdb::SortKeyConstantOperator<duckdb::interval_t>>
               (SortKeyVectorData *vector_data,SortKeyChunk chunk,SortKeyLengthInfo *result)

{
  bool bVar1;
  interval_t *piVar2;
  idx_t iVar3;
  reference pvVar4;
  long in_RDI;
  idx_t result_index;
  idx_t idx;
  idx_t r;
  interval_t *data;
  UnifiedVectorFormat *format;
  idx_t in_stack_ffffffffffffffa8;
  SortKeyChunk *this;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffffb8;
  ulong local_28;
  
  this = (SortKeyChunk *)&stack0x00000008;
  piVar2 = UnifiedVectorFormat::GetData<duckdb::interval_t>((UnifiedVectorFormat *)(in_RDI + 0x10));
  for (local_28 = this->start; local_28 < this->end; local_28 = local_28 + 1) {
    iVar3 = SelectionVector::get_index(*(SelectionVector **)(in_RDI + 0x10),local_28);
    SortKeyChunk::GetResultIndex(this,local_28);
    pvVar4 = vector<unsigned_long,_false>::operator[]
                       ((vector<unsigned_long,_false> *)this,in_stack_ffffffffffffffa8);
    *pvVar4 = *pvVar4 + 1;
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid(in_stack_ffffffffffffffb8,(idx_t)this);
    if (bVar1) {
      in_stack_ffffffffffffffb8 = *(TemplatedValidityMask<unsigned_long> **)(piVar2 + iVar3);
      in_stack_ffffffffffffffa8 =
           SortKeyConstantOperator<duckdb::interval_t>::GetEncodeLength(piVar2[iVar3]);
      pvVar4 = vector<unsigned_long,_false>::operator[]
                         ((vector<unsigned_long,_false> *)this,in_stack_ffffffffffffffa8);
      *pvVar4 = in_stack_ffffffffffffffa8 + *pvVar4;
    }
  }
  return;
}

Assistant:

void TemplatedGetSortKeyLength(SortKeyVectorData &vector_data, SortKeyChunk chunk, SortKeyLengthInfo &result) {
	auto &format = vector_data.format;
	auto data = UnifiedVectorFormat::GetData<typename OP::TYPE>(vector_data.format);
	for (idx_t r = chunk.start; r < chunk.end; r++) {
		auto idx = format.sel->get_index(r);
		auto result_index = chunk.GetResultIndex(r);
		result.variable_lengths[result_index]++; // every value is prefixed by a validity byte

		if (!format.validity.RowIsValid(idx)) {
			continue;
		}
		result.variable_lengths[result_index] += OP::GetEncodeLength(data[idx]);
	}
}